

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O1

uint RDL_translateCycArray(RDL_data *data,RDL_cycle **array,uint number,char ***ptr)

{
  uint uVar1;
  char **ppcVar2;
  ulong uVar3;
  RDL_cycle *pRVar4;
  ulong uVar5;
  
  if (data == (RDL_data *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"RDL_data is NULL!\n");
    number = 0xffffffff;
  }
  else {
    if (number != 0) {
      ppcVar2 = RDL_alloc2DCharArray(number,data->graph->E);
      uVar3 = 0;
      do {
        if (data->graph->E != 0) {
          uVar5 = 0;
          do {
            ppcVar2[uVar3][uVar5] = '\0';
            uVar5 = uVar5 + 1;
          } while (uVar5 < data->graph->E);
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 != number);
      uVar3 = 0;
      do {
        pRVar4 = array[uVar3];
        if (pRVar4->weight != 0) {
          uVar5 = 0;
          do {
            uVar1 = RDL_edgeId(data->graph,pRVar4->edges[uVar5][0],pRVar4->edges[uVar5][1]);
            ppcVar2[uVar3][uVar1] = '\x01';
            uVar5 = uVar5 + 1;
            pRVar4 = array[uVar3];
          } while (uVar5 < pRVar4->weight);
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 != number);
      goto LAB_00106c2a;
    }
    number = 0;
  }
  ppcVar2 = RDL_alloc2DCharArray(0,0);
LAB_00106c2a:
  *ptr = ppcVar2;
  return number;
}

Assistant:

unsigned RDL_translateCycArray(const RDL_data *data, RDL_cycle **array,
                               unsigned number, char ***ptr)
{
  unsigned i,j,RDL_edgeIdx;
  char **result;

  if (!data) {
    RDL_outputFunc(RDL_ERROR, "RDL_data is NULL!\n");
    (*ptr) = RDL_alloc2DCharArray(0, 0);
    return RDL_INVALID_RESULT;
  }

  if (number < 1) {
    (*ptr) = RDL_alloc2DCharArray(0, 0);
    return 0;
  }

  result = RDL_alloc2DCharArray(number, data->graph->E);
  for(i=0; i<number;  ++i)/*initialize to 0s*/
  {
    for(j=0; j<data->graph->E; ++j)
    {
      result[i][j] = 0;
    }
  }

  for(i=0; i<number; ++i)
  {
    for(j=0; j<array[i]->weight; ++j)
    {
      RDL_edgeIdx = RDL_edgeId(data->graph, array[i]->edges[j][0],
                               array[i]->edges[j][1]);
      result[i][RDL_edgeIdx] = 1;
    }
  }
  (*ptr) = result;
  return number;
}